

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop_info.cpp
# Opt level: O2

void __thiscall duckdb::DropInfo::DropInfo(DropInfo *this,DropInfo *info)

{
  pointer pEVar1;
  
  (this->super_ParseInfo).info_type = (info->super_ParseInfo).info_type;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__DropInfo_02792c00;
  (this->super_ParseInfo).field_0x9 = (info->super_ParseInfo).field_0x9;
  ::std::__cxx11::string::string((string *)&this->catalog,(string *)&info->catalog);
  ::std::__cxx11::string::string((string *)&this->schema,(string *)&info->schema);
  ::std::__cxx11::string::string((string *)&this->name,(string *)&info->name);
  this->if_not_found = info->if_not_found;
  this->cascade = info->cascade;
  this->allow_drop_internal = info->allow_drop_internal;
  if ((info->extra_drop_info).
      super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
      super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl == (ExtraDropInfo *)0x0) {
    (this->extra_drop_info).
    super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
    super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl = (ExtraDropInfo *)0x0;
  }
  else {
    pEVar1 = unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true>::
             operator->(&info->extra_drop_info);
    (*pEVar1->_vptr_ExtraDropInfo[2])(&this->extra_drop_info,pEVar1);
  }
  return;
}

Assistant:

DropInfo::DropInfo(const DropInfo &info)
    : ParseInfo(info.info_type), type(info.type), catalog(info.catalog), schema(info.schema), name(info.name),
      if_not_found(info.if_not_found), cascade(info.cascade), allow_drop_internal(info.allow_drop_internal),
      extra_drop_info(info.extra_drop_info ? info.extra_drop_info->Copy() : nullptr) {
}